

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

string * __thiscall
duckdb_re2::Prog::Inst::Dump_abi_cxx11_(string *__return_storage_ptr__,Inst *this)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  
  uVar4 = this->out_opcode_;
  switch(uVar4 & 7) {
  case 0:
    uVar2 = (this->field_1).out1_;
    pcVar5 = "alt -> %d | %d";
    break;
  case 1:
    uVar2 = (this->field_1).out1_;
    pcVar5 = "altmatch -> %d | %d";
    break;
  case 2:
    uVar1 = (this->field_1).byte_range.hint_foldcase_;
    pcVar5 = "/i";
    if ((uVar1 & 1) == 0) {
      pcVar5 = anon_var_dwarf_d0a3e5 + 9;
    }
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"byte%s [%02x-%02x] %d -> %d",pcVar5,
               (ulong)(this->field_1).byte_range.lo_,(ulong)(this->field_1).byte_range.hi_,
               (ulong)(uVar1 >> 1),uVar4 >> 4);
    return __return_storage_ptr__;
  case 3:
    uVar3 = (this->field_1).out1_;
    pcVar5 = "capture %d -> %d";
    goto LAB_004900bf;
  case 4:
    uVar3 = (this->field_1).out1_;
    pcVar5 = "emptywidth %#x -> %d";
LAB_004900bf:
    uVar2 = uVar4 >> 4;
    goto LAB_004900eb;
  case 5:
    uVar4 = (this->field_1).out1_;
    pcVar5 = "match! %d";
    goto LAB_00490112;
  case 6:
    uVar4 = uVar4 >> 4;
    pcVar5 = "nop -> %d";
LAB_00490112:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,pcVar5,(ulong)uVar4);
    return __return_storage_ptr__;
  case 7:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"fail");
    return __return_storage_ptr__;
  }
  uVar3 = uVar4 >> 4;
LAB_004900eb:
  StringPrintf_abi_cxx11_(__return_storage_ptr__,pcVar5,(ulong)uVar3,(ulong)uVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Prog::Inst::Dump() {
  switch (opcode()) {
    default:
      return StringPrintf("opcode %d", static_cast<int>(opcode()));

    case kInstAlt:
      return StringPrintf("alt -> %d | %d", out(), out1_);

    case kInstAltMatch:
      return StringPrintf("altmatch -> %d | %d", out(), out1_);

    case kInstByteRange:
      return StringPrintf("byte%s [%02x-%02x] %d -> %d",
                          foldcase() ? "/i" : "",
		                    byte_range.lo_, byte_range.hi_, hint(), out());

    case kInstCapture:
      return StringPrintf("capture %d -> %d", cap_, out());

    case kInstEmptyWidth:
      return StringPrintf("emptywidth %#x -> %d",
                          static_cast<int>(empty_), out());

    case kInstMatch:
      return StringPrintf("match! %d", match_id());

    case kInstNop:
      return StringPrintf("nop -> %d", out());

    case kInstFail:
      return StringPrintf("fail");
  }
}